

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O1

int Sim_SymmsIsCompatibleWithGroup(uint uSymm,Vec_Ptr_t *vNodesPi,int *pMap)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  uVar1 = vNodesPi->nSize;
  if ((ulong)uVar1 != 0) {
    if ((int)uVar1 < 1) {
      iVar3 = 0;
      iVar4 = 0;
    }
    else {
      uVar5 = 0;
      iVar4 = 0;
      iVar3 = 0;
      do {
        iVar2 = iVar4;
        if (pMap[*(int *)(((ulong)vNodesPi->pArray[uVar5] & 0xfffffffffffffffe) + 0x10)] ==
            uSymm >> 0x10) {
          iVar2 = 1;
        }
        if (pMap[*(int *)(((ulong)vNodesPi->pArray[uVar5] & 0xfffffffffffffffe) + 0x10)] ==
            (uSymm & 0xffff)) {
          iVar3 = 1;
          iVar2 = iVar4;
        }
        iVar4 = iVar2;
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    return (int)(iVar3 == iVar4);
  }
  return 1;
}

Assistant:

int Sim_SymmsIsCompatibleWithGroup( unsigned uSymm, Vec_Ptr_t * vNodesPi, int * pMap )
{
    Abc_Obj_t * pNode;
    int i, Ind1, Ind2, fHasVar1, fHasVar2;

    if ( vNodesPi->nSize == 0 )
        return 1;

    // get the indices of the PI variables
    Ind1 = (uSymm & 0xffff);
    Ind2 = (uSymm >> 16);

    // go through the PI nodes
    fHasVar1 = fHasVar2 = 0;
    for ( i = 0; i < vNodesPi->nSize; i++ )
    {
        pNode = Abc_ObjRegular((Abc_Obj_t *)vNodesPi->pArray[i]);
        if ( pMap[pNode->Id] == Ind1 )
            fHasVar1 = 1;
        else if ( pMap[pNode->Id] == Ind2 )
            fHasVar2 = 1;
    }
    return fHasVar1 == fHasVar2;
}